

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wait_handler.hpp
# Opt level: O1

void asio::detail::
     wait_handler<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/BrokerBase.cpp:884:26),_asio::any_io_executor>
     ::do_complete(void *owner,operation *base,error_code *param_3,size_t param_4)

{
  _func_void_any_executor_base_ptr_function_ptr *p_Var1;
  long *plVar2;
  undefined8 uVar3;
  function_view fVar4;
  handler_work<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_BrokerBase_cpp:884:26),_asio::any_io_executor,_void>
  w;
  binder1<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_BrokerBase_cpp:884:26),_std::error_code>
  handler;
  ptr p;
  allocator<void> local_d9;
  function local_d8;
  any_executor_base local_d0;
  undefined8 local_a0;
  undefined1 local_98 [24];
  undefined8 uStack_80;
  int local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  BrokerBase *local_68;
  activeProtector *paStack_60;
  ptr local_50;
  ptr local_38;
  
  local_50.h = (type *)(base + 2);
  local_50.v = (wait_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_BrokerBase_cpp:884:26),_asio::any_io_executor>
                *)base;
  local_50.p = (wait_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_BrokerBase_cpp:884:26),_asio::any_io_executor>
                *)base;
  execution::detail::any_executor_base::any_executor_base
            (&local_d0,(any_executor_base *)&base[2].task_result_);
  local_a0 = *(undefined8 *)&base[4].task_result_;
  *(undefined1 **)&base[4].task_result_ =
       execution::
       any_executor<asio::execution::context_as_t<asio::execution_context&>,asio::execution::detail::blocking::never_t<0>,asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>>,asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>>,asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>>,asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>>,asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>>>
       ::prop_fns_table<void>()::fns;
  local_98._0_8_ = base[2].next_;
  local_98._8_8_ = base[2].func_;
  local_50.h = (type *)local_98;
  local_98._16_8_ = base[1].next_;
  uStack_80 = (error_category *)base[1].func_;
  ptr::reset(&local_50);
  if (owner != (void *)0x0) {
    if (local_d0.target_ == (void *)0x0) {
      binder1<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/BrokerBase.cpp:884:26),_std::error_code>
      ::operator()((binder1<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_BrokerBase_cpp:884:26),_std::error_code>
                    *)local_98);
    }
    else if ((local_d0.target_fns_)->blocking_execute ==
             (_func_void_any_executor_base_ptr_function_view *)0x0) {
      p_Var1 = (local_d0.target_fns_)->execute;
      local_68 = (BrokerBase *)local_98._0_8_;
      paStack_60 = (activeProtector *)local_98._8_8_;
      local_78 = local_98._16_4_;
      uStack_74 = local_98._20_4_;
      uStack_70 = (undefined4)uStack_80;
      uStack_6c = uStack_80._4_4_;
      local_38.a = &local_d9;
      plVar2 = (long *)__tls_get_addr(&PTR_0057ce40);
      if (*plVar2 == 0) {
        uVar3 = 0;
      }
      else {
        uVar3 = *(undefined8 *)(*plVar2 + 8);
      }
      local_d8.impl_ =
           (impl_base *)
           thread_info_base::allocate<asio::detail::thread_info_base::executor_function_tag>
                     (uVar3,0x30,8);
      local_38.p = (impl<asio::detail::binder1<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_BrokerBase_cpp:884:26),_std::error_code>,_std::allocator<void>_>
                    *)0x0;
      local_d8.impl_[1].complete_ = (_func_void_impl_base_ptr_bool *)local_68;
      local_d8.impl_[2].complete_ = (_func_void_impl_base_ptr_bool *)paStack_60;
      local_d8.impl_[3].complete_ = (_func_void_impl_base_ptr_bool *)CONCAT44(uStack_74,local_78);
      local_d8.impl_[4].complete_ = (_func_void_impl_base_ptr_bool *)CONCAT44(uStack_6c,uStack_70);
      (local_d8.impl_)->complete_ =
           executor_function::
           complete<asio::detail::binder1<helics::BrokerBase::queueProcessingLoop()::__0,std::error_code>,std::allocator<void>>
      ;
      local_38.v = (void *)0x0;
      executor_function::
      impl<asio::detail::binder1<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/BrokerBase.cpp:884:26),_std::error_code>,_std::allocator<void>_>
      ::ptr::reset(&local_38);
      (*p_Var1)(&local_d0,&local_d8);
      if (local_d8.impl_ != (impl_base *)0x0) {
        (*(local_d8.impl_)->complete_)(local_d8.impl_,false);
      }
    }
    else {
      fVar4.function_ = local_98;
      fVar4.complete_ =
           executor_function_view::
           complete<asio::detail::binder1<helics::BrokerBase::queueProcessingLoop()::__0,std::error_code>>
      ;
      (*(local_d0.target_fns_)->blocking_execute)(&local_d0,fVar4);
    }
  }
  if (local_d0.target_ != (void *)0x0) {
    (*(local_d0.object_fns_)->destroy)(&local_d0);
  }
  ptr::reset(&local_50);
  return;
}

Assistant:

static void do_complete(void* owner, operation* base,
      const asio::error_code& /*ec*/,
      std::size_t /*bytes_transferred*/)
  {
    // Take ownership of the handler object.
    wait_handler* h(static_cast<wait_handler*>(base));
    ptr p = { asio::detail::addressof(h->handler_), h, h };

    ASIO_HANDLER_COMPLETION((*h));

    // Take ownership of the operation's outstanding work.
    handler_work<Handler, IoExecutor> w(
        static_cast<handler_work<Handler, IoExecutor>&&>(
          h->work_));

    // Make a copy of the handler so that the memory can be deallocated before
    // the upcall is made. Even if we're not about to make an upcall, a
    // sub-object of the handler may be the true owner of the memory associated
    // with the handler. Consequently, a local copy of the handler is required
    // to ensure that any owning sub-object remains valid until after we have
    // deallocated the memory here.
    detail::binder1<Handler, asio::error_code>
      handler(h->handler_, h->ec_);
    p.h = asio::detail::addressof(handler.handler_);
    p.reset();

    // Make the upcall if required.
    if (owner)
    {
      fenced_block b(fenced_block::half);
      ASIO_HANDLER_INVOCATION_BEGIN((handler.arg1_));
      w.complete(handler, handler.handler_);
      ASIO_HANDLER_INVOCATION_END;
    }
  }